

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O0

void __thiscall Subscriber::Subscriber(Subscriber *this,string *name)

{
  string *name_local;
  Subscriber *this_local;
  
  this->_vptr_Subscriber = (_func_int **)&PTR_on_error_001edc30;
  this->dirty = false;
  this->fd = 0;
  this->expected = 0;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  return;
}

Assistant:

Subscriber::Subscriber(std::string name) : dirty(false), name(std::move(name)) {}